

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O2

bool __thiscall cmInstallSubdirectoryGenerator::HaveInstall(cmInstallSubdirectoryGenerator *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  int iVar3;
  pointer ppcVar4;
  
  ppcVar1 = (this->Makefile->InstallGenerators).
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppcVar2 = (this->Makefile->InstallGenerators).
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppcVar4 = ppcVar2;
    if (ppcVar4 == ppcVar1) break;
    iVar3 = (*((*ppcVar4)->super_cmScriptGenerator)._vptr_cmScriptGenerator[8])();
    ppcVar2 = ppcVar4 + 1;
  } while ((char)iVar3 == '\0');
  return ppcVar4 != ppcVar1;
}

Assistant:

bool cmInstallSubdirectoryGenerator::HaveInstall()
{
  for (auto generator : this->Makefile->GetInstallGenerators()) {
    if (generator->HaveInstall()) {
      return true;
    }
  }

  return false;
}